

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

_Bool reencrypt_key(PageantKey *pk)

{
  ssh_key *psVar1;
  _Bool _Var2;
  
  if (((pk->sort).ssh_version == 2) && (pk->encrypted_key_file != (strbuf *)0x0)) {
    _Var2 = true;
    if ((pk->field_3).rkey != (RSAKey *)0x0) {
      safefree(((pk->field_3).rkey)->modulus);
      psVar1 = ((pk->field_3).skey)->key;
      (*psVar1->vt->freekey)(psVar1);
      safefree((pk->field_3).rkey);
      (pk->field_3).rkey = (RSAKey *)0x0;
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool reencrypt_key(PageantKey *pk)
{
    if (pk->sort.ssh_version != 2) {
        /*
         * We don't support storing SSH-1 keys in encrypted form at
         * all.
         */
        return false;
    }

    if (!pk->encrypted_key_file) {
        /*
         * We can't re-encrypt a key if it doesn't have an encrypted
         * form. (We could make one up, of course - but with what
         * passphrase that we could expect the user to know later?)
         */
        return false;
    }

    /* Only actually free pk->skey if it exists. But we return success
     * regardless, so that 'please ensure this key isn't stored
     * decrypted' is idempotent. */
    if (pk->skey) {
        sfree(pk->skey->comment);
        ssh_key_free(pk->skey->key);
        sfree(pk->skey);
        pk->skey = NULL;
    }

    return true;
}